

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::For_AST_Node::eval_internal(For_AST_Node *this,Dispatch_State *t_ss)

{
  byte bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  Boxed_Value BVar2;
  Break_Loop *anon_var_0;
  Continue_Loop *anon_var_0_1;
  Scope_Push_Pop spp;
  undefined7 in_stack_ffffffffffffff60;
  Dispatch_State *in_stack_ffffffffffffff90;
  AST_Node *in_stack_ffffffffffffff98;
  Boxed_Value *in_stack_ffffffffffffffa0;
  
  eval::detail::Scope_Push_Pop::Scope_Push_Pop((Scope_Push_Pop *)in_RDI,(Dispatch_State *)in_RDI);
  std::
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                *)(in_RSI + 0x60),0);
  std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x26f0e8);
  AST_Node::eval(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  Boxed_Value::~Boxed_Value((Boxed_Value *)0x26f109);
  while( true ) {
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                  *)(in_RSI + 0x60),1);
    std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x26f124);
    AST_Node::eval(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    bVar1 = AST_Node::get_bool_condition(in_stack_ffffffffffffffa0);
    Boxed_Value::~Boxed_Value((Boxed_Value *)0x26f155);
    if ((bVar1 & 1) == 0) break;
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                  *)(in_RSI + 0x60),3);
    std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x26f17d);
    AST_Node::eval(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    Boxed_Value::~Boxed_Value((Boxed_Value *)0x26f19e);
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                  *)(in_RSI + 0x60),2);
    std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x26f26c);
    AST_Node::eval(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    Boxed_Value::~Boxed_Value((Boxed_Value *)0x26f28d);
  }
  Boxed_Value::Boxed_Value((Boxed_Value *)0x26f21b);
  eval::detail::Scope_Push_Pop::~Scope_Push_Pop
            ((Scope_Push_Pop *)CONCAT17(bVar1,in_stack_ffffffffffffff60));
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE{
          chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);

          try {
            for (
                children[0]->eval(t_ss);
                get_bool_condition(children[1]->eval(t_ss));
                children[2]->eval(t_ss)
                ) {
              try {
                // Body of Loop
                children[3]->eval(t_ss);
              } catch (detail::Continue_Loop &) {
                // we got a continue exception, which means all of the remaining 
                // loop implementation is skipped and we just need to continue to
                // the next iteration step
              }
            }
          } catch (detail::Break_Loop &) {
            // loop broken
          }

          return Boxed_Value();
        }